

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_violate(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  ROOM_INDEX_DATA *pRoomIndex;
  char *pcVar4;
  char *pcVar5;
  CHAR_DATA **ppCVar6;
  
  if (*argument == '\0') {
    pcVar5 = "Goto where?\n\r";
  }
  else {
    pRoomIndex = find_location(ch,argument);
    if (pRoomIndex == (ROOM_INDEX_DATA *)0x0) {
      pcVar5 = "No such location.\n\r";
    }
    else {
      bVar2 = room_is_private(pRoomIndex);
      if (bVar2) {
        if (ch->fighting != (CHAR_DATA *)0x0) {
          stop_fighting(ch,true);
        }
        ppCVar6 = &ch->in_room->people;
        do {
          pCVar1 = *ppCVar6;
          if (pCVar1 == (CHAR_DATA *)0x0) {
            char_from_room(ch);
            char_to_room(ch,pRoomIndex);
            ppCVar6 = &ch->in_room->people;
            while (pCVar1 = *ppCVar6, pCVar1 != (CHAR_DATA *)0x0) {
              iVar3 = get_trust(pCVar1);
              if (ch->invis_level <= iVar3) {
                if ((ch->pcdata == (PC_DATA *)0x0) || (pcVar5 = ch->pcdata->bamfin, *pcVar5 == '\0')
                   ) {
                  pcVar4 = "$n appears in a swirling mist.";
                  pcVar5 = (char *)0x0;
                }
                else {
                  pcVar4 = "$t";
                }
                act(pcVar4,ch,pcVar5,pCVar1,2);
              }
              ppCVar6 = &pCVar1->next_in_room;
            }
            do_look(ch,"auto");
            return;
          }
          iVar3 = get_trust(pCVar1);
          if (ch->invis_level <= iVar3) {
            iVar3 = get_trust(pCVar1);
            if ((iVar3 == 0x33) && (ch->invis_level == 0x33)) {
              bVar2 = is_heroimm(pCVar1);
              if (!bVar2) goto LAB_002c5b00;
            }
            if ((ch->pcdata == (PC_DATA *)0x0) || (pcVar5 = ch->pcdata->bamfout, *pcVar5 == '\0')) {
              pcVar4 = "$n leaves in a swirling mist.";
              pcVar5 = (char *)0x0;
            }
            else {
              pcVar4 = "$t";
            }
            act(pcVar4,ch,pcVar5,pCVar1,2);
          }
LAB_002c5b00:
          ppCVar6 = &pCVar1->next_in_room;
        } while( true );
      }
      pcVar5 = "That room isn\'t private, use goto.\n\r";
    }
  }
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void do_violate(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *location;
	CHAR_DATA *rch;

	if (argument[0] == '\0')
	{
		send_to_char("Goto where?\n\r", ch);
		return;
	}

	location = find_location(ch, argument);

	if (location == nullptr)
	{
		send_to_char("No such location.\n\r", ch);
		return;
	}

	if (!room_is_private(location))
	{
		send_to_char("That room isn't private, use goto.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
		stop_fighting(ch, true);

	for (rch = ch->in_room->people; rch != nullptr; rch = rch->next_in_room)
	{
		if (get_trust(rch) >= ch->invis_level)
		{
			if (get_trust(rch) == LEVEL_HERO && ch->invis_level == LEVEL_HERO && !is_heroimm(rch))
				continue;

			if (ch->pcdata != nullptr && ch->pcdata->bamfout[0] != '\0')
				act("$t", ch, ch->pcdata->bamfout, rch, TO_VICT);
			else
				act("$n leaves in a swirling mist.", ch, nullptr, rch, TO_VICT);
		}
	}

	char_from_room(ch);
	char_to_room(ch, location);

	for (rch = ch->in_room->people; rch != nullptr; rch = rch->next_in_room)
	{
		if (get_trust(rch) >= ch->invis_level)
		{
			if (ch->pcdata != nullptr && ch->pcdata->bamfin[0] != '\0')
				act("$t", ch, ch->pcdata->bamfin, rch, TO_VICT);
			else
				act("$n appears in a swirling mist.", ch, nullptr, rch, TO_VICT);
		}
	}

	do_look(ch, "auto");
}